

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_set.cpp
# Opt level: O0

void __thiscall
icu_63::TransliterationRuleSet::TransliterationRuleSet
          (TransliterationRuleSet *this,TransliterationRuleSet *other)

{
  UBool UVar1;
  UVector *this_00;
  TransliterationRule *this_01;
  TransliterationRule *other_00;
  bool bVar2;
  TransliterationRule *local_c0;
  UVector *local_a0;
  undefined1 local_94 [8];
  UParseError p;
  TransliterationRule *tempTranslitRule;
  UErrorCode local_24;
  UErrorCode local_20;
  UErrorCode status;
  int32_t len;
  int32_t i;
  TransliterationRuleSet *other_local;
  TransliterationRuleSet *this_local;
  
  this->_vptr_TransliterationRuleSet = (_func_int **)&PTR__TransliterationRuleSet_005b5920;
  this->ruleVector = (UVector *)0x0;
  this->rules = (TransliterationRule **)0x0;
  this->maxContextLength = other->maxContextLength;
  local_c0 = (TransliterationRule *)other->index;
  _len = other;
  other_local = this;
  memcpy(this->index,local_c0,0x404);
  local_24 = U_ZERO_ERROR;
  this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)local_c0);
  local_a0 = (UVector *)0x0;
  if (this_00 != (UVector *)0x0) {
    local_c0 = (TransliterationRule *)_deleteRule;
    UVector::UVector(this_00,_deleteRule,(UElementsAreEqual *)0x0,&local_24);
    local_a0 = this_00;
  }
  this->ruleVector = local_a0;
  if (((_len->ruleVector != (UVector *)0x0) && (this->ruleVector != (UVector *)0x0)) &&
     (UVar1 = ::U_SUCCESS(local_24), UVar1 != '\0')) {
    local_20 = UVector::size(_len->ruleVector);
    status = U_ZERO_ERROR;
    while( true ) {
      bVar2 = false;
      if (status < local_20) {
        UVar1 = ::U_SUCCESS(local_24);
        bVar2 = UVar1 != '\0';
      }
      if (!bVar2) goto LAB_00275218;
      this_01 = (TransliterationRule *)UMemory::operator_new((UMemory *)0x88,(size_t)local_c0);
      p.postContext[0xd]._1_1_ = 0;
      local_c0 = (TransliterationRule *)0x0;
      if (this_01 != (TransliterationRule *)0x0) {
        p.postContext[0xd]._1_1_ = 1;
        unique0x1000021c = this_01;
        other_00 = (TransliterationRule *)UVector::elementAt(_len->ruleVector,status);
        TransliterationRule::TransliterationRule(this_01,other_00);
        local_c0 = this_01;
      }
      if (local_c0 == (TransliterationRule *)0x0) break;
      UVector::addElement(this->ruleVector,local_c0,&local_24);
      UVar1 = ::U_FAILURE(local_24);
      if (UVar1 != '\0') goto LAB_00275218;
      status = status + U_ILLEGAL_ARGUMENT_ERROR;
    }
    local_24 = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_00275218:
  if ((_len->rules != (TransliterationRule **)0x0) && (UVar1 = ::U_SUCCESS(local_24), UVar1 != '\0')
     ) {
    (*this->_vptr_TransliterationRuleSet[4])(this,local_94,&local_24);
  }
  return;
}

Assistant:

TransliterationRuleSet::TransliterationRuleSet(const TransliterationRuleSet& other) :
    UMemory(other),
    ruleVector(0),
    rules(0),
    maxContextLength(other.maxContextLength) {

    int32_t i, len;
    uprv_memcpy(index, other.index, sizeof(index));
    UErrorCode status = U_ZERO_ERROR;
    ruleVector = new UVector(&_deleteRule, NULL, status);
    if (other.ruleVector != 0 && ruleVector != 0 && U_SUCCESS(status)) {
        len = other.ruleVector->size();
        for (i=0; i<len && U_SUCCESS(status); ++i) {
            TransliterationRule *tempTranslitRule = new TransliterationRule(*(TransliterationRule*)other.ruleVector->elementAt(i));
            // Null pointer test
            if (tempTranslitRule == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }
            ruleVector->addElement(tempTranslitRule, status);
            if (U_FAILURE(status)) {
                break;
            }
        }
    }
    if (other.rules != 0 && U_SUCCESS(status)) {
        UParseError p;
        freeze(p, status);
    }
}